

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

RawSchema ** __thiscall
capnp::SchemaLoader::Validator::makeDependencyArray(Validator *this,uint32_t *count)

{
  RawSchema *pRVar1;
  bool bVar2;
  size_t sVar3;
  RawSchema **ppRVar4;
  Fault local_88;
  Fault f;
  Entry *dep;
  Iterator __end2;
  Iterator __begin2;
  TreeMap<unsigned_long,_capnp::_::RawSchema_*> *__range2;
  undefined1 auStack_28 [4];
  uint pos;
  ArrayPtr<const_capnp::_::RawSchema_*> result;
  uint32_t *count_local;
  Validator *this_local;
  
  result.size_ = (size_t)count;
  sVar3 = kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::size(&this->dependencies);
  *(int *)result.size_ = (int)sVar3;
  _auStack_28 = kj::Arena::allocateArray<capnp::_::RawSchema_const*>
                          (&this->loader->arena,(ulong)*(uint *)result.size_);
  __range2._4_4_ = 0;
  kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::begin
            ((Iterator *)&__end2.inner.row,&this->dependencies);
  kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::end((Iterator *)&dep,&this->dependencies);
  while( true ) {
    bVar2 = kj::_::
            MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>_>
            ::operator!=((MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>_>
                          *)&__end2.inner.row,
                         (MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>_>
                          *)&dep);
    if (!bVar2) break;
    f.exception = (Exception *)
                  kj::_::
                  MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>_>
                  ::operator*((MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>_>
                               *)&__end2.inner.row);
    pRVar1 = (RawSchema *)((f.exception)->ownFile).content.size_;
    ppRVar4 = kj::ArrayPtr<const_capnp::_::RawSchema_*>::operator[]
                        ((ArrayPtr<const_capnp::_::RawSchema_*> *)auStack_28,(ulong)__range2._4_4_);
    *ppRVar4 = pRVar1;
    kj::_::
    MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>_>
    ::operator++((MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<unsigned_long,_capnp::_::RawSchema_*>::Entry>_>
                  *)&__end2.inner.row);
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  if (__range2._4_4_ == *(uint *)result.size_) {
    ppRVar4 = kj::ArrayPtr<const_capnp::_::RawSchema_*>::begin
                        ((ArrayPtr<const_capnp::_::RawSchema_*> *)auStack_28);
    return ppRVar4;
  }
  kj::_::Debug::Fault::Fault
            (&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
             ,0x107,FAILED,"pos == *count","");
  kj::_::Debug::Fault::fatal(&local_88);
}

Assistant:

const _::RawSchema** makeDependencyArray(uint32_t* count) {
    *count = dependencies.size();
    kj::ArrayPtr<const _::RawSchema*> result =
        loader.arena.allocateArray<const _::RawSchema*>(*count);
    uint pos = 0;
    for (auto& dep: dependencies) {
      result[pos++] = dep.value;
    }
    KJ_DASSERT(pos == *count);
    return result.begin();
  }